

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O0

bool __thiscall TestRegistry::endOfGroup(TestRegistry *this,UtestShell *test)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  long *in_RSI;
  UtestShell *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 local_4e;
  
  bVar2 = false;
  bVar1 = false;
  local_4e = true;
  if (in_RSI != (long *)0x0) {
    lVar3 = (**(code **)(*in_RSI + 0x18))();
    local_4e = true;
    if (lVar3 != 0) {
      UtestShell::getGroup(in_stack_ffffffffffffff98);
      bVar2 = true;
      (**(code **)(*in_RSI + 0x18))();
      UtestShell::getGroup(in_stack_ffffffffffffff98);
      bVar1 = true;
      local_4e = ::operator!=((SimpleString *)
                              CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                              (SimpleString *)in_stack_ffffffffffffff98);
    }
  }
  if (bVar1) {
    SimpleString::~SimpleString((SimpleString *)0x1735be);
  }
  if (bVar2) {
    SimpleString::~SimpleString((SimpleString *)0x1735d1);
  }
  return local_4e;
}

Assistant:

bool TestRegistry::endOfGroup(UtestShell* test)
{
    return (!test || !test->getNext() || test->getGroup() != test->getNext()->getGroup());
}